

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  int iVar1;
  wchar_t wVar2;
  undefined4 in_EDX;
  wchar_t *in_RSI;
  wchar_t *end;
  wchar_t *start;
  wchar_t sep;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t type;
  wchar_t n;
  wchar_t fields;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [4];
  undefined7 in_stack_ffffffffffffff50;
  undefined1 uVar3;
  wchar_t in_stack_ffffffffffffff58;
  wchar_t in_stack_ffffffffffffff5c;
  wchar_t in_stack_ffffffffffffff60;
  wchar_t in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  wchar_t in_stack_ffffffffffffff6c;
  wchar_t local_90;
  wchar_t local_8c [3];
  int iVar4;
  int iVar5;
  wchar_t *local_68 [4];
  wchar_t *local_48;
  wchar_t *local_40;
  wchar_t *local_38;
  wchar_t *local_30;
  undefined4 local_1c;
  wchar_t *local_18 [3];
  
  local_1c = in_EDX;
  local_18[0] = in_RSI;
  do {
    uVar3 = false;
    if (local_18[0] != (wchar_t *)0x0) {
      uVar3 = *local_18[0] != L'\0';
    }
    if ((bool)uVar3 == false) {
      return L'\0';
    }
    iVar5 = 0;
    do {
      next_field_w(local_18,(wchar_t **)&stack0xffffffffffffff60,
                   (wchar_t **)&stack0xffffffffffffff58,(wchar_t *)&stack0xffffffffffffff6c);
      if (iVar5 < 4) {
        local_68[(long)iVar5 * 2] =
             (wchar_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
        local_68[(long)iVar5 * 2 + 1] =
             (wchar_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      }
      iVar5 = iVar5 + 1;
      iVar4 = iVar5;
    } while (in_stack_ffffffffffffff6c == L':');
    for (; iVar4 < 4; iVar4 = iVar4 + 1) {
      local_68[(long)iVar4 * 2 + 1] = (wchar_t *)0x0;
      local_68[(long)iVar4 * 2] = (wchar_t *)0x0;
    }
    local_90 = L'\xffffffff';
    isint_w(local_68[2],local_68[3],&local_90);
    if ((local_90 == L'\xffffffff') && (3 < iVar5)) {
      isint_w(local_38,local_30,&local_90);
    }
    if (((long)local_68[1] - (long)local_68[0] >> 2 < 8) ||
       (iVar1 = wmemcmp(local_68[0],anon_var_dwarf_408a4,7), iVar1 != 0)) {
      local_8c[2] = local_1c;
    }
    else {
      local_8c[2] = 0x200;
      local_68[0] = local_68[0] + 7;
    }
    wVar2 = prefix_w(local_68[0],local_68[1],anon_var_dwarf_408bb);
    if (wVar2 == L'\0') {
      wVar2 = prefix_w(local_68[0],local_68[1],anon_var_dwarf_408d2);
      if (wVar2 == L'\0') {
        wVar2 = prefix_w(local_68[0],local_68[1],anon_var_dwarf_408e9);
        if (wVar2 == L'\0') {
          wVar2 = prefix_w(local_68[0],local_68[1],anon_var_dwarf_408f4);
          if (wVar2 == L'\0') {
            return L'\xffffffec';
          }
          if ((((iVar5 != 2) || (local_68[3] <= local_68[2])) ||
              (wVar2 = ismode_w(local_68[2],local_68[3],local_8c), wVar2 == L'\0')) &&
             (((iVar5 != 3 || (local_68[2] != local_68[3])) ||
              ((local_40 <= local_48 ||
               (wVar2 = ismode_w(local_48,local_40,local_8c), wVar2 == L'\0')))))) {
            return L'\xffffffec';
          }
          local_8c[1] = 0x2715;
        }
        else {
          if ((((iVar5 != 2) || (local_68[3] <= local_68[2])) ||
              (wVar2 = ismode_w(local_68[2],local_68[3],local_8c), wVar2 == L'\0')) &&
             ((((iVar5 != 3 || (local_68[2] != local_68[3])) || (local_40 <= local_48)) ||
              (wVar2 = ismode_w(local_48,local_40,local_8c), wVar2 == L'\0')))) {
            return L'\xffffffec';
          }
          local_8c[1] = 0x2716;
        }
      }
      else {
        wVar2 = ismode_w(local_48,local_40,local_8c);
        if (wVar2 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_90 == L'\xffffffff') && (local_68[3] <= local_68[2])) {
          local_8c[1] = 0x2714;
        }
        else {
          local_8c[1] = 0x2713;
        }
      }
    }
    else {
      wVar2 = ismode_w(local_48,local_40,local_8c);
      if (wVar2 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_90 == L'\xffffffff') && (local_68[3] <= local_68[2])) {
        local_8c[1] = 0x2712;
      }
      else {
        local_8c[1] = 0x2711;
      }
    }
    archive_acl_add_entry_w_len
              ((archive_acl *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58,(wchar_t *)CONCAT17(uVar3,in_stack_ffffffffffffff50),
               CONCAT44(iVar5,iVar4));
  } while( true );
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}